

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

QRhiWidgetPrivate * __thiscall QRhiWidgetPrivate::grabFramebuffer(QRhiWidgetPrivate *this)

{
  QRhiWidget *this_00;
  double dVar1;
  undefined3 uVar2;
  Api AVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  QRhiReadbackDescription *pQVar8;
  QRhiWidgetPrivate *in_RSI;
  QRhiTexture *pQVar9;
  uchar *puVar10;
  QRhi *pQVar11;
  Format FVar12;
  long in_FS_OFFSET;
  QRect local_c8;
  bool needsInit;
  bool readCompleted;
  _Any_data local_a8;
  undefined4 local_98;
  undefined4 uStack_94;
  code *pcStack_90;
  undefined4 local_88;
  int iStack_84;
  int iStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  uchar *puStack_70;
  undefined8 local_68;
  QRhiCommandBuffer *cb;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI->noSize == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QImage::QImage((QImage *)this);
      return this;
    }
    goto LAB_002e858f;
  }
  this_00 = *(QRhiWidget **)&(in_RSI->super_QWidgetPrivate).field_0x8;
  ensureRhi(in_RSI);
  pQVar11 = in_RSI->rhi;
  if (pQVar11 == (QRhi *)0x0) {
    (in_RSI->offscreenRenderer).m_config.m_debugLayer = (in_RSI->config).m_debugLayer;
    uVar2 = *(undefined3 *)&(in_RSI->config).field_0x1;
    AVar3 = (in_RSI->config).m_api;
    (in_RSI->offscreenRenderer).m_config.m_enable = (in_RSI->config).m_enable;
    *(undefined3 *)&(in_RSI->offscreenRenderer).m_config.field_0x1 = uVar2;
    (in_RSI->offscreenRenderer).m_config.m_api = AVar3;
    QBackingStoreRhiSupport::create();
    pQVar11 = (in_RSI->offscreenRenderer).m_rhi;
    in_RSI->rhi = pQVar11;
    if (pQVar11 != (QRhi *)0x0) goto LAB_002e82ad;
    local_a8._0_4_ = 2;
    uStack_94 = 0;
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    local_98 = 0;
    pcStack_90 = (code *)0x5e5d56;
    QMessageLogger::warning
              (local_a8._M_pod_data,"QRhiWidget: Failed to create dedicated QRhi for grabbing");
    QRhiWidget::renderFailed(this_00);
LAB_002e82c4:
    QImage::QImage((QImage *)this);
  }
  else {
LAB_002e82ad:
    cb = (QRhiCommandBuffer *)0x0;
    iVar6 = QRhi::beginOffscreenFrame(pQVar11,&cb,0);
    if (iVar6 != 0) goto LAB_002e82c4;
    local_88 = 0xaaaaaaaa;
    uStack_7c = 0xaaaaaaaa;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    local_98 = 0;
    uStack_94 = 0;
    pcStack_90 = (code *)0x0;
    iStack_84 = -1;
    iStack_80 = -1;
    local_78 = 0;
    puStack_70 = (uchar *)0x0;
    local_68 = 0;
    readCompleted = false;
    needsInit = false;
    ensureTexture(in_RSI,&needsInit);
    if (in_RSI->msaaColorBuffer != (QRhiRenderBuffer *)0x0 ||
        in_RSI->colorTexture != (QRhiTexture *)0x0) {
      if ((needsInit != true) || (bVar4 = invokeInitialize(in_RSI,cb), bVar4)) {
        (**(code **)(*(long *)&this_00->super_QWidget + 0x1a8))(this_00,cb);
      }
      pQVar8 = (QRhiReadbackDescription *)QRhi::nextResourceUpdateBatch();
      local_58._4_4_ = local_a8._4_4_;
      local_58._0_4_ = local_a8._0_4_;
      local_58._12_4_ = local_a8._12_4_;
      local_58._8_4_ = local_a8._8_4_;
      local_a8._M_unused._M_object = &readCompleted;
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_48 = (code *)CONCAT44(uStack_94,local_98);
      local_98 = 0x2e87fe;
      uStack_94 = 0;
      local_40 = pcStack_90;
      pcStack_90 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qrhiwidget.cpp:409:32)>
                   ::_M_invoke;
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      pQVar9 = in_RSI->resolveTexture;
      if (pQVar9 == (QRhiTexture *)0x0) {
        pQVar9 = in_RSI->colorTexture;
      }
      QRhiReadbackDescription::QRhiReadbackDescription
                ((QRhiReadbackDescription *)local_58._M_pod_data,pQVar9);
      QRhiResourceUpdateBatch::readBackTexture(pQVar8,(QRhiReadbackResult *)&local_58);
      QRhiCommandBuffer::resourceUpdate((QRhiResourceUpdateBatch *)cb);
    }
    QRhi::endOffscreenFrame(in_RSI->rhi,0);
    uVar7 = in_RSI->widgetTextureFormat - RGBA16F;
    if (uVar7 < 3) {
      FVar12 = *(Format *)(&DAT_005e7c70 + (ulong)uVar7 * 4);
    }
    else {
      FVar12 = Format_RGBA8888;
    }
    local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_unused._M_object = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puVar10 = puStack_70;
    if (puStack_70 == (uchar *)0x0) {
      puVar10 = (uchar *)&QByteArray::_empty;
    }
    QImage::QImage((QImage *)local_58._M_pod_data,puVar10,iStack_84,iStack_80,FVar12,
                   (_func_void_void_ptr *)0x0,(void *)0x0);
    *(undefined1 **)&(this->super_QWidgetPrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(this->super_QWidgetPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)this);
    cVar5 = QRhi::isYUpInFramebuffer();
    if (cVar5 == '\0') {
      QImage::copy(&local_c8);
    }
    else {
      QImage::flipped((QImage *)&local_c8,
                      (QFlagsStorageHelper<Qt::Orientation,_4>)SUB84(&local_58,0));
    }
    QImage::operator=((QImage *)this,(QImage *)&local_c8);
    QImage::~QImage((QImage *)&local_c8);
    dVar1 = (double)QPaintDevice::devicePixelRatio();
    QImage::setDevicePixelRatio(dVar1);
    QImage::~QImage((QImage *)local_58._M_pod_data);
    QRhiReadbackResult::~QRhiReadbackResult((QRhiReadbackResult *)&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
LAB_002e858f:
  __stack_chk_fail();
}

Assistant:

QImage QRhiWidgetPrivate::grabFramebuffer()
{
    Q_Q(QRhiWidget);
    if (noSize)
        return QImage();

    ensureRhi();
    if (!rhi) {
        // The widget (and its parent chain, if any) may not be shown at
        // all, yet one may still want to use it for grabs. This is
        // ridiculous of course because the rendering infrastructure is
        // tied to the top-level widget that initializes upon expose, but
        // it has to be supported.
        offscreenRenderer.setConfig(config);
        // no window passed in, so no swapchain, but we get a functional QRhi which we own
        offscreenRenderer.create();
        rhi = offscreenRenderer.rhi();
        if (!rhi) {
            qWarning("QRhiWidget: Failed to create dedicated QRhi for grabbing");
            emit q->renderFailed();
            return QImage();
        }
    }

    QRhiCommandBuffer *cb = nullptr;
    if (rhi->beginOffscreenFrame(&cb) != QRhi::FrameOpSuccess)
        return QImage();

    QRhiReadbackResult readResult;
    bool readCompleted = false;
    bool needsInit = false;
    ensureTexture(&needsInit);

    if (colorTexture || msaaColorBuffer) {
        bool canRender = true;
        if (needsInit)
            canRender = invokeInitialize(cb);
        if (canRender)
            q->render(cb);

        QRhiResourceUpdateBatch *readbackBatch = rhi->nextResourceUpdateBatch();
        readResult.completed = [&readCompleted] { readCompleted = true; };
        readbackBatch->readBackTexture(resolveTexture ? resolveTexture : colorTexture, &readResult);
        cb->resourceUpdate(readbackBatch);
    }

    rhi->endOffscreenFrame();

    if (readCompleted) {
        QImage::Format imageFormat = QImage::Format_RGBA8888;
        switch (widgetTextureFormat) {
        case QRhiWidget::TextureFormat::RGBA8:
            break;
        case QRhiWidget::TextureFormat::RGBA16F:
            imageFormat = QImage::Format_RGBA16FPx4;
            break;
        case QRhiWidget::TextureFormat::RGBA32F:
            imageFormat = QImage::Format_RGBA32FPx4;
            break;
        case QRhiWidget::TextureFormat::RGB10A2:
            imageFormat = QImage::Format_BGR30;
            break;
        }
        QImage wrapperImage(reinterpret_cast<const uchar *>(readResult.data.constData()),
                            readResult.pixelSize.width(), readResult.pixelSize.height(),
                            imageFormat);
        QImage result;
        if (rhi->isYUpInFramebuffer())
            result = wrapperImage.flipped();
        else
            result = wrapperImage.copy();
        result.setDevicePixelRatio(q->devicePixelRatio());
        return result;
    } else {
        Q_UNREACHABLE();
    }

    return QImage();
}